

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtFindFirstDiffBit(word *pIn1,word *pIn2,int nVars)

{
  int iVar1;
  int local_28;
  int nWords;
  int w;
  int nVars_local;
  word *pIn2_local;
  word *pIn1_local;
  
  iVar1 = Abc_TtWordNum(nVars);
  local_28 = 0;
  while( true ) {
    if (iVar1 <= local_28) {
      return -1;
    }
    if (pIn1[local_28] != pIn2[local_28]) break;
    local_28 = local_28 + 1;
  }
  iVar1 = Abc_Tt6FirstBit(pIn1[local_28] ^ pIn2[local_28]);
  return local_28 * 0x40 + iVar1;
}

Assistant:

static inline int Abc_TtFindFirstDiffBit( word * pIn1, word * pIn2, int nVars )
{
    int w, nWords = Abc_TtWordNum(nVars);
    for ( w = 0; w < nWords; w++ )
        if ( pIn1[w] ^ pIn2[w] )
            return 64*w + Abc_Tt6FirstBit(pIn1[w] ^ pIn2[w]);
    return -1;
}